

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.cpp
# Opt level: O0

tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *
Kernel::toNumeralMul(TermList t)

{
  bool bVar1;
  tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *in_RDI;
  TermList sort;
  uint f;
  Term *term;
  TermList *in_stack_fffffffffffffef8;
  tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *ptVar2;
  RationalConstantType *in_stack_ffffffffffffff00;
  tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *this;
  Option<Kernel::TermList> *in_stack_ffffffffffffff08;
  Term *in_stack_ffffffffffffff78;
  uint64_t local_68;
  uint local_5c;
  Term *local_58;
  anon_class_32_4_2a798d63 in_stack_ffffffffffffffc0;
  
  bVar1 = TermList::isVar((TermList *)in_stack_ffffffffffffff00);
  if (bVar1) {
    Lib::Option<Kernel::TermList>::OptionBase
              ((Option<Kernel::TermList> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    rat((int)((ulong)in_RDI >> 0x20));
    std::make_tuple<Lib::Option<Kernel::TermList>,Kernel::RationalConstantType>
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    RationalConstantType::~RationalConstantType(in_stack_ffffffffffffff00);
    Lib::Option<Kernel::TermList>::~Option((Option<Kernel::TermList> *)0x92eca9);
  }
  else {
    local_58 = TermList::term((TermList *)0x92ed09);
    local_5c = Term::functor(local_58);
    local_68 = (uint64_t)SortHelper::getResultSort(in_stack_ffffffffffffff78);
    ptVar2 = (tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *)&local_68;
    this = (tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType> *)&local_5c;
    tryNumTraits<Kernel::toNumeralMul(Kernel::TermList)::__0>(in_stack_ffffffffffffffc0);
    Lib::OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::
    unwrap((OptionBase<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_> *)
           0x92ed9b);
    std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>::tuple(this,ptVar2);
    Lib::Option<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_>::~Option
              ((Option<std::tuple<Lib::Option<Kernel::TermList>,_Kernel::RationalConstantType>_> *)
               0x92edbd);
  }
  return in_RDI;
}

Assistant:

auto toNumeralMul(TermList t) -> std::tuple<Option<TermList>, RationalConstantType> {
  if (t.isVar()) {
    return std::make_tuple(Option<TermList>(t), rat(1));
  } else {
    auto term = t.term();
    auto f = term->functor();
    auto sort = SortHelper::getResultSort(term);
    return tryNumTraits([&](auto numTraits) {
        if (sort != numTraits.sort()) {
          return Option<std::tuple<Option<TermList>, RationalConstantType>>();

        } else if (f == numTraits.mulF() && numTraits.isNumeral(*term->nthArgument(0))) {
          /* t = k * t' ( for some numeral k ) */
          return some(std::make_tuple(
                some(*term->nthArgument(1)),  /* <- t' */
                rat(numTraits.tryNumeral(*term->nthArgument(0)).unwrap()) /* <- k */
                ));

        } else if (numTraits.isNumeral(t)) {
          /* t is a numeral */
          return some(std::make_tuple(
                Option<TermList>(), 
                rat(numTraits.tryNumeral(t).unwrap())
                ));

        } else {
          /* t is uninterpreted */
          return some(std::make_tuple(Option<TermList>(t), RationalConstantType(1)));
        }
    }).unwrap();
  }
}